

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::save(elfio *this,ostream *stream)

{
  bool bVar1;
  Elf_Half EVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  pointer peVar7;
  pointer peVar8;
  bool local_84;
  bool local_83;
  bool local_82;
  bool local_81;
  bool local_65;
  uint local_64;
  undefined8 uStack_40;
  bool is_still_good;
  Elf_Half local_32;
  long local_30;
  Elf_Half local_22;
  ostream *local_20;
  ostream *stream_local;
  elfio *this_local;
  
  local_20 = stream;
  stream_local = (ostream *)this;
  uVar6 = std::ios::operator!((ios *)(stream + *(long *)(*(long *)stream + -0x18)));
  if (((uVar6 & 1) == 0) && (bVar1 = std::operator==(&this->header,(nullptr_t)0x0), !bVar1)) {
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    local_22 = Segments::size(&this->segments);
    (*peVar7->_vptr_elf_header[0x1d])(peVar7,&local_22);
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    EVar2 = Segments::size(&this->segments);
    if (EVar2 == 0) {
      local_64 = 0;
    }
    else {
      peVar8 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::
               operator->(&this->header);
      local_64 = (*peVar8->_vptr_elf_header[7])();
      local_64 = local_64 & 0xffff;
    }
    local_30 = (long)(int)local_64;
    (*peVar7->_vptr_elf_header[0x1f])(peVar7,&local_30);
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    local_32 = Sections::size(&this->sections);
    (*peVar7->_vptr_elf_header[0x19])(peVar7,&local_32);
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    uStack_40 = 0;
    (*peVar7->_vptr_elf_header[0x1b])(peVar7,&stack0xffffffffffffffc0);
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    uVar3 = (*peVar7->_vptr_elf_header[7])();
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    uVar4 = (*peVar7->_vptr_elf_header[9])();
    peVar7 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                       (&this->header);
    iVar5 = (*peVar7->_vptr_elf_header[0x1c])();
    this->current_file_pos =
         (ulong)(uVar3 & 0xffff) + (ulong)(uVar4 & 0xffff) * (ulong)(ushort)iVar5;
    calc_segment_alignment(this);
    bVar1 = layout_segments_and_their_sections(this);
    local_65 = false;
    if (bVar1) {
      local_65 = layout_sections_without_segments(this);
    }
    local_81 = false;
    if (local_65 != false) {
      local_81 = layout_section_table(this);
    }
    local_82 = false;
    if (local_81 != false) {
      local_82 = save_header(this,local_20);
    }
    local_83 = false;
    if (local_82 != false) {
      local_83 = save_sections(this,local_20);
    }
    local_84 = false;
    if (local_83 != false) {
      local_84 = save_segments(this,local_20);
    }
    return local_84;
  }
  return false;
}

Assistant:

bool save( std::ostream& stream )
    {
        if ( !stream || header == nullptr ) {
            return false;
        }

        // Define layout specific header fields
        // The position of the segment table is fixed after the header.
        // The position of the section table is variable and needs to be fixed
        // before saving.
        header->set_segments_num( segments.size() );
        header->set_segments_offset(
            segments.size() > 0 ? header->get_header_size() : 0 );
        header->set_sections_num( sections.size() );
        header->set_sections_offset( 0 );

        // Layout the first section right after the segment table
        current_file_pos =
            header->get_header_size() +
            header->get_segment_entry_size() *
                static_cast<Elf_Xword>( header->get_segments_num() );

        calc_segment_alignment();

        bool is_still_good = layout_segments_and_their_sections();
        is_still_good = is_still_good && layout_sections_without_segments();
        is_still_good = is_still_good && layout_section_table();

        is_still_good = is_still_good && save_header( stream );
        is_still_good = is_still_good && save_sections( stream );
        is_still_good = is_still_good && save_segments( stream );

        return is_still_good;
    }